

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsChaseCamera.cpp
# Opt level: O3

void __thiscall
chrono::utils::ChChaseCamera::ChChaseCamera(ChChaseCamera *this,shared_ptr<chrono::ChBody> *chassis)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined1 auVar3 [32];
  undefined1 local_98 [16];
  double local_88;
  undefined1 local_78 [16];
  double local_68;
  undefined1 local_60 [24];
  undefined1 local_48 [16];
  double local_38;
  double local_30;
  undefined1 local_28 [16];
  double local_18;
  
  this->m_state = Chase;
  auVar3 = ZEXT1632(ZEXT816(0) << 0x40);
  this->m_up = (ChVector<double>)auVar3._0_24_;
  (this->m_fwd).m_data[0] = (double)auVar3._24_8_;
  *(undefined1 (*) [32])((this->m_up).m_data + 2) = auVar3;
  p_Var2 = (chassis->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  p_Var1 = (chassis->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->m_chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (chassis->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->m_chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  local_98 = ZEXT816(0) << 0x20;
  auVar3 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])((this->m_ptOnChassis).m_data + 2) = auVar3;
  this->m_ptOnChassis = (ChVector<double>)auVar3._0_24_;
  (this->m_driverCsys).pos.m_data[0] = (double)auVar3._24_8_;
  (this->m_driverCsys).rot.m_data[0] = 1.0;
  *(undefined1 (*) [16])((this->m_driverCsys).rot.m_data + 1) = local_98;
  (this->m_driverCsys).rot.m_data[3] = 0.0;
  this->m_mult = 1.0;
  this->m_loc = (ChVector<double>)auVar3._0_24_;
  (this->m_lastLoc).m_data[0] = (double)auVar3._24_8_;
  *(undefined1 (*) [32])((this->m_loc).m_data + 2) = auVar3;
  this->m_horizGain = 4.0;
  this->m_vertGain = 2.0;
  this->m_minMult = 0.5;
  this->m_maxMult = 10.0;
  local_60._0_8_ = 1.0;
  local_68 = 0.0;
  local_38 = 0.0;
  local_30 = 1.0;
  local_18 = 0.0;
  local_88 = 1.0;
  local_78 = local_98;
  local_60._8_16_ = local_98;
  local_48 = local_98;
  local_28 = local_98;
  Initialize(this,(ChVector<double> *)local_78,(ChCoordsys<double> *)local_48,5.0,1.0,
             (ChVector<double> *)local_98,(ChVector<double> *)local_60);
  return;
}

Assistant:

ChChaseCamera::ChChaseCamera(std::shared_ptr<ChBody> chassis)
    : m_chassis(chassis),
      m_mult(1),
      m_maxMult(10),
      m_minMult(0.5f),
      m_horizGain(4.0f),
      m_vertGain(2.0f),
      m_state(Chase) {
    Initialize(ChVector<>(0, 0, 0), ChCoordsys<>(), 5, 1);
}